

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * GetFunctionUpvalue(ExpressionContext *ctx,SynBase *source,VariableData *target)

{
  uint uniqueId;
  Allocator *allocator;
  ScopeData *pSVar1;
  SynBase *source_00;
  int iVar2;
  uint uVar3;
  VariableData **ppVVar4;
  undefined4 extraout_var;
  TypeRef *type;
  undefined4 extraout_var_00;
  VariableData *this;
  SynIdentifier *name;
  undefined4 extraout_var_03;
  char *__function;
  VariableData *variable;
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U> *local_58;
  undefined8 local_50;
  SynBase *local_48;
  InplaceStr upvalueName;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  upvalueName = GetFunctionVariableUpvalueName(ctx,target);
  ppVVar4 = SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::find
                      (&ctx->upvalueMap,&upvalueName);
  if (ppVVar4 != (VariableData **)0x0) {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    ExprVariableAccess::ExprVariableAccess
              ((ExprVariableAccess *)CONCAT44(extraout_var,iVar2),source,(*ppVVar4)->type,*ppVVar4);
    return &((ExprVariableAccess *)CONCAT44(extraout_var,iVar2))->super_ExprBase;
  }
  local_58 = &ctx->upvalueMap;
  type = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
  uVar3 = anon_unknown.dwarf_9fd58::AllocateGlobalVariable
                    (ctx,source,(type->super_TypeBase).alignment,(type->super_TypeBase).size);
  local_50 = CONCAT44(extraout_var_00,uVar3);
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
  this = (VariableData *)CONCAT44(extraout_var_01,iVar2);
  allocator = ctx->allocator;
  pSVar1 = ctx->globalScope;
  uVar3 = (type->super_TypeBase).alignment;
  local_48 = source;
  iVar2 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
  source_00 = local_48;
  name = (SynIdentifier *)CONCAT44(extraout_var_02,iVar2);
  (name->super_SynBase).typeID = 4;
  (name->super_SynBase).begin = (Lexeme *)0x0;
  (name->super_SynBase).end = (Lexeme *)0x0;
  (name->super_SynBase).pos.begin = (char *)0x0;
  (name->super_SynBase).pos.end = (char *)0x0;
  *(undefined8 *)((long)&(name->super_SynBase).pos.end + 2) = 0;
  *(undefined8 *)((long)&(name->super_SynBase).next + 2) = 0;
  (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
  (name->name).begin = upvalueName.begin;
  (name->name).end = upvalueName.end;
  uniqueId = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uniqueId + 1;
  VariableData::VariableData
            (this,allocator,local_48,pSVar1,uVar3,&type->super_TypeBase,name,(uint)local_50,uniqueId
            );
  pSVar1 = ctx->globalScope;
  uVar3 = (pSVar1->variables).count;
  variable = this;
  if (uVar3 == (pSVar1->variables).max) {
    SmallArray<VariableData_*,_4U>::grow(&pSVar1->variables,uVar3);
  }
  ppVVar4 = (pSVar1->variables).data;
  if (ppVVar4 != (VariableData **)0x0) {
    uVar3 = (pSVar1->variables).count;
    (pSVar1->variables).count = uVar3 + 1;
    ppVVar4[uVar3] = variable;
    pSVar1 = ctx->globalScope;
    uVar3 = (pSVar1->allVariables).count;
    if (uVar3 == (pSVar1->allVariables).max) {
      SmallArray<VariableData_*,_4U>::grow(&pSVar1->allVariables,uVar3);
    }
    ppVVar4 = (pSVar1->allVariables).data;
    if (ppVVar4 != (VariableData **)0x0) {
      uVar3 = (pSVar1->allVariables).count;
      (pSVar1->allVariables).count = uVar3 + 1;
      ppVVar4[uVar3] = variable;
      uVar3 = (ctx->variables).count;
      if (uVar3 == (ctx->variables).max) {
        SmallArray<VariableData_*,_128U>::grow(&ctx->variables,uVar3);
      }
      ppVVar4 = (ctx->variables).data;
      if (ppVVar4 != (VariableData **)0x0) {
        uVar3 = (ctx->variables).count;
        (ctx->variables).count = uVar3 + 1;
        ppVVar4[uVar3] = variable;
        uVar3 = (ctx->upvalues).count;
        if (uVar3 == (ctx->upvalues).max) {
          SmallArray<VariableData_*,_128U>::grow(&ctx->upvalues,uVar3);
        }
        ppVVar4 = (ctx->upvalues).data;
        if (ppVVar4 != (VariableData **)0x0) {
          uVar3 = (ctx->upvalues).count;
          (ctx->upvalues).count = uVar3 + 1;
          ppVVar4[uVar3] = variable;
          SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::insert
                    (local_58,&upvalueName,&variable);
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          ExprVariableAccess::ExprVariableAccess
                    ((ExprVariableAccess *)CONCAT44(extraout_var_03,iVar2),source_00,variable->type,
                     variable);
          return &((ExprVariableAccess *)CONCAT44(extraout_var_03,iVar2))->super_ExprBase;
        }
      }
      __function = 
      "void SmallArray<VariableData *, 128>::push_back(const T &) [T = VariableData *, N = 128]";
      goto LAB_00154e40;
    }
  }
  __function = 
  "void SmallArray<VariableData *, 4>::push_back(const T &) [T = VariableData *, N = 4]";
LAB_00154e40:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

ExprBase* GetFunctionUpvalue(ExpressionContext &ctx, SynBase *source, VariableData *target)
{
	InplaceStr upvalueName = GetFunctionVariableUpvalueName(ctx, target);

	if(VariableData **variable = ctx.upvalueMap.find(upvalueName))
	{
		return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, (*variable)->type, *variable);
	}

	TypeBase *type = ctx.GetReferenceType(ctx.typeVoid);

	unsigned offset = AllocateGlobalVariable(ctx, source, type->alignment, type->size);
	VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.globalScope, type->alignment, type, new (ctx.get<SynIdentifier>()) SynIdentifier(upvalueName), offset, ctx.uniqueVariableId++);

	ctx.globalScope->variables.push_back(variable);
	ctx.globalScope->allVariables.push_back(variable);

	ctx.variables.push_back(variable);

	ctx.upvalues.push_back(variable);
	ctx.upvalueMap.insert(upvalueName, variable);

	return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, variable->type, variable);
}